

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::MaybeString(AsciiParser *this,StringData *str)

{
  uint8_t uVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  StreamReader *pSVar8;
  bool bVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  char nc;
  stringstream ss;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (str != (StringData *)0x0) {
    pSVar8 = this->_sr;
    uVar12 = pSVar8->length_;
    uVar5 = pSVar8->idx_;
    iVar3 = (this->_curr_cursor).row;
    iVar4 = (this->_curr_cursor).col;
    if (uVar5 + 1 <= uVar12) {
      uVar1 = pSVar8->binary_[uVar5];
      pSVar8->idx_ = uVar5 + 1;
      if ((uVar1 == '\"') || (uVar1 == '\'')) {
        pSVar8 = this->_sr;
        uVar12 = pSVar8->length_;
        uVar10 = pSVar8->idx_;
        if (uVar10 < uVar12) {
          bVar9 = false;
          do {
            if (pSVar8->binary_[uVar10] == '\0') break;
            if (uVar12 < uVar10 + 1) {
LAB_00375167:
              iVar7 = 1;
              if (uVar5 <= uVar12) {
                pSVar8->idx_ = uVar5;
              }
            }
            else {
              uVar2 = pSVar8->binary_[uVar10];
              pSVar8->idx_ = uVar10 + 1;
              if (uVar2 == '\n') goto LAB_00375167;
              if (uVar2 == '\\') {
                bVar6 = LookChar1(this,(char *)&local_1f8);
                iVar7 = 0;
                if (bVar6) {
                  if ((uint8_t)local_1f8._M_dataplus._M_p == '\"') {
                    pcVar11 = "\"";
LAB_003751ff:
                    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,1);
                    pSVar8 = this->_sr;
                    bVar6 = false;
                    iVar7 = 2;
                    if ((-2 < (long)pSVar8->idx_) &&
                       (uVar12 = pSVar8->idx_ + 1, uVar12 <= pSVar8->length_)) {
                      pSVar8->idx_ = uVar12;
                      iVar7 = 2;
                      goto LAB_00375225;
                    }
                  }
                  else {
                    bVar6 = true;
                    if ((uint8_t)local_1f8._M_dataplus._M_p == '\'') {
                      pcVar11 = "\'";
                      goto LAB_003751ff;
                    }
                  }
                }
                else {
                  iVar7 = 1;
LAB_00375225:
                  bVar6 = false;
                }
                if (bVar6) goto LAB_0037522f;
              }
              else {
                if (uVar2 == '\r') goto LAB_00375167;
LAB_0037522f:
                if (uVar1 == '\'') {
                  if (uVar2 != '\'') {
LAB_00375250:
                    local_1f8._M_dataplus._M_p._0_1_ = uVar2;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              (local_1a8,(char *)&local_1f8,1);
                    iVar7 = 0;
                    goto LAB_00375174;
                  }
                }
                else if (uVar2 != '\"') goto LAB_00375250;
                bVar9 = true;
                iVar7 = 3;
              }
            }
LAB_00375174:
            if ((iVar7 != 0) && (iVar7 != 2)) {
              if (iVar7 != 3) goto LAB_00375357;
              break;
            }
            pSVar8 = this->_sr;
            uVar12 = pSVar8->length_;
            uVar10 = pSVar8->idx_;
          } while (uVar10 < uVar12);
          if (bVar9) {
            ::std::__cxx11::stringbuf::str();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(uint8_t)local_1f8._M_dataplus._M_p) !=
                &local_1f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       (uint8_t)local_1f8._M_dataplus._M_p),
                              local_1f8.field_2._M_allocated_capacity + 1);
            }
            ::std::__cxx11::stringbuf::str();
            unescapeControlSequence(&local_1f8,&local_1d8);
            ::std::__cxx11::string::operator=((string *)str,(string *)&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,(uint8_t)local_1f8._M_dataplus._M_p) !=
                &local_1f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       (uint8_t)local_1f8._M_dataplus._M_p),
                              local_1f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            str->line_col = iVar4;
            str->line_row = iVar3;
            str->is_triple_quoted = false;
            (this->_curr_cursor).col =
                 (this->_curr_cursor).col + (int)local_1f8._M_string_length + 2;
            bVar9 = true;
            goto LAB_00375359;
          }
        }
        pSVar8 = this->_sr;
        uVar12 = pSVar8->length_;
      }
    }
    if (uVar5 <= uVar12) {
      pSVar8->idx_ = uVar5;
    }
  }
LAB_00375357:
  bVar9 = false;
LAB_00375359:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar9;
}

Assistant:

bool AsciiParser::MaybeString(value::StringData *str) {
  std::stringstream ss;

  if (!str) {
    return false;
  }

  auto loc = CurrLoc();
  auto start_cursor = _curr_cursor;

  char c0;
  if (!Char1(&c0)) {
    SeekTo(loc);
    return false;
  }

  // ' or " allowed.
  if ((c0 != '"') && (c0 != '\'')) {
    SeekTo(loc);
    return false;
  }

  bool single_quote = (c0 == '\'');

  bool end_with_quotation{false};

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      SeekTo(loc);
      return false;
    }

    if ((c == '\n') || (c == '\r')) {
      SeekTo(loc);
      return false;
    }

    if (c == '\\') {
      // escaped quote? \" \'
      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == '\'') {
        ss << "'";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      } else if (nc == '"') {
        ss << "\"";
        _sr->seek_from_current(1);  // advance 1 char
        continue;
      }
    }

    if (single_quote) {
      if (c == '\'') {
        end_with_quotation = true;
        break;
      }
    } else {
      if (c == '"') {
        end_with_quotation = true;
        break;
      }
    }

    ss << c;
  }

  if (!end_with_quotation) {
    SeekTo(loc);
    return false;
  }

  DCOUT("Single quoted string found. col " << start_cursor.col << ", row "
                                           << start_cursor.row);

  size_t displayed_string_len = ss.str().size();
  str->value = unescapeControlSequence(ss.str());
  str->line_col = start_cursor.col;
  str->line_row = start_cursor.row;
  str->is_triple_quoted = false;

  _curr_cursor.col += int(displayed_string_len + 2);  // +2 for quotation chars

  return true;
}